

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

void __thiscall FReader::FReader(FReader *this,char *buffer,size_t length)

{
  Document *this_00;
  uint16_t uVar1;
  uint uVar2;
  Pointer pGVar3;
  FJSONObject *pFVar4;
  Pointer pGVar5;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> is;
  MemoryStream ms;
  Document doc;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> EStack_b8;
  MemoryStream local_b0;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  local_90;
  
  (this->mObjects).Array = (FJSONObject *)0x0;
  (this->mObjects).Most = 0;
  (this->mObjects).Count = 0;
  this_00 = &this->mDoc;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(this_00,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  this->mObjectsRead = false;
  (this->mDObjects).Array = (DObject **)0x0;
  (this->mDObjects).Most = 0;
  (this->mDObjects).Count = 0;
  this->mKeyValue = (Value *)0x0;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&local_90,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  local_b0.end_ = buffer + length;
  local_b0.src_ = buffer;
  local_b0.begin_ = buffer;
  local_b0.size_ = length;
  rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::EncodedInputStream
            (&EStack_b8,&local_b0);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::
  ParseStream<16u,rapidjson::UTF8<char>,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)this_00,&EStack_b8);
  uVar1 = (this->mDoc).
          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          .data_.f.flags;
  pGVar3 = (Pointer)(this->mDoc).
                    super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    .data_.s.str;
  TArray<FJSONObject,_FJSONObject>::Grow(&this->mObjects,1);
  pGVar5 = (Pointer)0x0;
  if (uVar1 == 3) {
    pGVar5 = pGVar3;
  }
  pFVar4 = (this->mObjects).Array;
  uVar2 = (this->mObjects).Count;
  pFVar4[uVar2].mObject =
       &this_00->
        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ;
  pFVar4[uVar2].mIterator.ptr_ = pGVar5;
  pFVar4[uVar2].mIndex = 0;
  (this->mObjects).Count = uVar2 + 1;
  this->mPlayers[0] = -1;
  this->mPlayers[1] = -1;
  this->mPlayers[2] = -1;
  this->mPlayers[3] = -1;
  this->mPlayers[4] = -1;
  this->mPlayers[5] = -1;
  this->mPlayers[6] = -1;
  this->mPlayers[7] = -1;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&local_90);
  return;
}

Assistant:

FReader(const char *buffer, size_t length)
	{
		rapidjson::Document doc;
		mDoc.Parse(buffer, length);
		mObjects.Push(FJSONObject(&mDoc));
		memset(mPlayers, -1, sizeof(mPlayers));
	}